

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

size_t __thiscall
compiler::CompilerAstWalker::indexOfConstant<long>
          (CompilerAstWalker *this,long t,vector<long,_std::allocator<long>_> *vec,
          unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *lookup)

{
  ulong uVar1;
  iterator __position;
  pointer plVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  long local_20;
  long t_local;
  
  uVar1 = (lookup->_M_h)._M_bucket_count;
  uVar3 = (ulong)t % uVar1;
  p_Var4 = (lookup->_M_h)._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var4->_M_nxt, p_Var5 = p_Var4, p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)t)) {
    while (p_Var4 = p_Var6, p_Var6 = p_Var4->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, p_Var6[1]._M_nxt == (_Hash_node_base *)t)) goto LAB_0011db8b;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_0011db8b:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var5->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    __position._M_current =
         (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    plVar2 = (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    local_20 = t;
    if (__position._M_current ==
        (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)vec,__position,&local_20);
    }
    else {
      *__position._M_current = t;
      (vec->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
    p_Var6 = (_Hash_node_base *)((long)__position._M_current - (long)plVar2 >> 3);
    std::
    _Hashtable<long,std::pair<long_const,unsigned_long>,std::allocator<std::pair<long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,unsigned_long>>
              ((_Hashtable<long,std::pair<long_const,unsigned_long>,std::allocator<std::pair<long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)lookup);
  }
  else {
    p_Var6 = p_Var6[2]._M_nxt;
  }
  return (size_t)p_Var6;
}

Assistant:

std::size_t indexOfConstant(T t, std::vector<T> & vec, std::unordered_map<T, std::size_t> & lookup) noexcept {
    auto find = lookup.find(t);

    if (find == lookup.end()) {
      std::size_t vecLen = vec.size();
      vec.push_back(t);
      lookup.insert(std::make_pair(t, vecLen));
      return vecLen;

    } else {
      return find->second;
    }
  }